

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall lest::expected::expected(expected *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_a9;
  text local_a8;
  text local_88;
  text local_68;
  location local_48;
  
  std::__cxx11::string::string((string *)&local_68,"failed: didn\'t get exception",&local_a9);
  location::location(&local_48,where_);
  std::__cxx11::string::string((string *)&local_88,(string *)expr_);
  std::__cxx11::string::string((string *)&local_a8,(string *)excpt_);
  message::message(&this->super_message,&local_68,&local_48,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  *(undefined ***)&this->super_message = &PTR__message_00110d68;
  return;
}

Assistant:

expected( location where_, text expr_, text excpt_ = "" )
    : message{ "failed: didn't get exception", where_, expr_, excpt_ } {}